

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexSeparableKernel::splitB(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  Res RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  
  iVar2 = this->v;
  iVar8 = this->vw;
  RVar1 = this->res;
  iVar3 = this->u;
  if (-iVar2 < iVar8) {
    iVar8 = this->uw;
    pfVar6 = this->ku;
    pfVar7 = this->kv;
    k->res = RVar1;
    k->u = iVar3;
    k->v = (1 << (RVar1.vlog2 & 0x1fU)) + iVar2;
    k->uw = iVar8;
    k->vw = -iVar2;
    memcpy(k->kubuff,pfVar6,(long)iVar8 << 2);
    memcpy(k->kvbuff,pfVar7,(long)iVar2 * -4);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar8 = this->vw + iVar2;
    this->kv = this->kv + -(long)iVar2;
  }
  else {
    iVar4 = this->uw;
    pfVar6 = this->ku;
    pfVar7 = this->kv;
    iVar5 = this->rot;
    k->res = RVar1;
    k->u = iVar3;
    k->v = iVar2;
    k->uw = iVar4;
    k->vw = iVar8;
    memcpy(k->kubuff,pfVar6,(long)iVar4 << 2);
    memcpy(k->kvbuff,pfVar7,(long)iVar8 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = iVar5;
    k->v = (1 << ((this->res).vlog2 & 0x1fU)) + iVar2;
    iVar8 = 0;
  }
  this->v = 0;
  this->vw = iVar8;
  return;
}

Assistant:

void splitB(PtexSeparableKernel& k)
    {
        // split off bottom piece of width w into k
        int w = -v;
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v          uw vw  ku  kv
            k.set(res, u, res.v()-w, uw, w, ku, kv);

            // update local
            v = 0;
            vw -= w;
            kv += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v += res.v();
            v = 0; vw = 0;
        }
    }